

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop.c
# Opt level: O3

void uv__loop_close(uv_loop_t *loop)

{
  uv_mutex_t *mutex;
  void *ptr;
  
  uv__signal_loop_cleanup(loop);
  uv__platform_loop_delete(loop);
  uv__async_stop(loop);
  if (loop->emfile_fd != -1) {
    uv__close(loop->emfile_fd);
    loop->emfile_fd = -1;
  }
  if (loop->backend_fd != -1) {
    uv__close(loop->backend_fd);
    loop->backend_fd = -1;
  }
  mutex = &loop->wq_mutex;
  uv_mutex_lock(mutex);
  if (loop->wq == (void **)loop->wq[0]) {
    if ((loop->active_reqs).count == 0) {
      uv_mutex_unlock(mutex);
      uv_mutex_destroy(mutex);
      uv_rwlock_destroy(&loop->cloexec_lock);
      uv__free(loop->watchers);
      loop->watchers = (uv__io_t **)0x0;
      loop->nwatchers = 0;
      ptr = loop->internal_fields;
      uv_mutex_destroy((uv_mutex_t *)((long)ptr + 0x18));
      uv__free(ptr);
      loop->internal_fields = (void *)0x0;
      return;
    }
    __assert_fail("!uv__has_active_reqs(loop)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmlibuv/src/unix/loop.c"
                  ,0xb8,"void uv__loop_close(uv_loop_t *)");
  }
  __assert_fail("QUEUE_EMPTY(&loop->wq) && \"thread pool work queue not empty!\"",
                "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmlibuv/src/unix/loop.c"
                ,0xb7,"void uv__loop_close(uv_loop_t *)");
}

Assistant:

void uv__loop_close(uv_loop_t* loop) {
  uv__loop_internal_fields_t* lfields;

  uv__signal_loop_cleanup(loop);
  uv__platform_loop_delete(loop);
  uv__async_stop(loop);

  if (loop->emfile_fd != -1) {
    uv__close(loop->emfile_fd);
    loop->emfile_fd = -1;
  }

  if (loop->backend_fd != -1) {
    uv__close(loop->backend_fd);
    loop->backend_fd = -1;
  }

  uv_mutex_lock(&loop->wq_mutex);
  assert(QUEUE_EMPTY(&loop->wq) && "thread pool work queue not empty!");
  assert(!uv__has_active_reqs(loop));
  uv_mutex_unlock(&loop->wq_mutex);
  uv_mutex_destroy(&loop->wq_mutex);

  /*
   * Note that all thread pool stuff is finished at this point and
   * it is safe to just destroy rw lock
   */
  uv_rwlock_destroy(&loop->cloexec_lock);

#if 0
  assert(QUEUE_EMPTY(&loop->pending_queue));
  assert(QUEUE_EMPTY(&loop->watcher_queue));
  assert(loop->nfds == 0);
#endif

  uv__free(loop->watchers);
  loop->watchers = NULL;
  loop->nwatchers = 0;

  lfields = uv__get_internal_fields(loop);
  uv_mutex_destroy(&lfields->loop_metrics.lock);
  uv__free(lfields);
  loop->internal_fields = NULL;
}